

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O1

Value * __thiscall flow::IRBuilder::createS2N(IRBuilder *this,Value *rhs,string *name)

{
  int iVar1;
  bool bVar2;
  _Alloc_hider __nptr;
  long lVar3;
  int *piVar4;
  undefined8 uVar5;
  ConstantValue<long,_(flow::LiteralType)2> *unaff_R15;
  string local_70;
  string *local_50;
  Value *local_48;
  pointer local_40;
  LiteralType local_34;
  
  local_48 = rhs;
  if (rhs->type_ != String) {
    __assert_fail("rhs->type() == LiteralType::String",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x26b,"Value *flow::IRBuilder::createS2N(Value *, const std::string &)");
  }
  if (rhs == (Value *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(rhs,&Value::typeinfo,
                           &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
  }
  bVar2 = true;
  if (lVar3 != 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_50 = name;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,*(long *)(lVar3 + 0x48),
               *(long *)(lVar3 + 0x50) + *(long *)(lVar3 + 0x48));
    __nptr._M_p = local_70._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    lVar3 = strtol(__nptr._M_p,&local_40,10);
    if (local_40 == __nptr._M_p) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((int)lVar3 == lVar3) && (*piVar4 != 0x22)) {
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
      }
      local_40 = (pointer)(long)(int)lVar3;
      unaff_R15 = IRProgram::get<flow::ConstantValue<long,(flow::LiteralType)2>,long>
                            (this->program_,&this->program_->numbers_,(long *)&local_40);
      name = local_50;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      bVar2 = false;
      goto LAB_00143c85;
    }
    uVar5 = std::__throw_out_of_range("stoi");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar5);
  }
LAB_00143c85:
  if (bVar2) {
    local_34 = Number;
    makeName(&local_70,this,name);
    unaff_R15 = (ConstantValue<long,_(flow::LiteralType)2> *)
                insert<flow::CastInstr,flow::LiteralType,flow::Value*&,std::__cxx11::string>
                          (this,&local_34,&local_48,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return (Value *)unaff_R15;
}

Assistant:

Value* IRBuilder::createS2N(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::String);

  if (auto value = dynamic_cast<ConstantString*>(rhs)) {
    try {
      return get(stoi(value->get()));
    } catch (...) {
      // fall through to default behaviour
    }
  }

  return insert<CastInstr>(LiteralType::Number, rhs, makeName(name));
}